

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_valddi.cpp
# Opt level: O1

ze_result_t
validation_layer::zetMetricCreateFromProgrammableExp2
          (zet_metric_programmable_exp_handle_t hMetricProgrammable,uint32_t parameterCount,
          zet_metric_programmable_param_value_exp_t *pParameterValues,char *pName,char *pDescription
          ,uint32_t *pMetricHandleCount,zet_metric_handle_t *phMetricHandles)

{
  long lVar1;
  long lVar2;
  code *pcVar3;
  long lVar4;
  long *plVar5;
  long lVar6;
  ze_result_t zVar7;
  undefined8 uVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  ze_result_t local_b0;
  long *local_68 [2];
  long local_58 [2];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  lVar6 = context;
  lVar2 = *(long *)(context + 0xd50);
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,
             "zetMetricCreateFromProgrammableExp2(hMetricProgrammable, parameterCount, pParameterValues, pName, pDescription, pMetricHandleCount, phMetricHandles)"
             ,"");
  if (*(char *)(lVar2 + 1) == '\x01') {
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    spdlog::logger::log(*(logger **)(lVar2 + 8),0.0);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  pcVar3 = *(code **)(lVar6 + 0x750);
  if (pcVar3 == (code *)0x0) {
    zVar7 = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    lVar2 = *(long *)(lVar6 + 0xd30);
    lVar4 = *(long *)(lVar6 + 0xd38);
    uVar10 = lVar4 - lVar2 >> 3;
    bVar11 = lVar4 != lVar2;
    if (bVar11) {
      uVar9 = 1;
      do {
        plVar5 = *(long **)(*(long *)(*(long *)(lVar6 + 0xd30) + -8 + uVar9 * 8) + 0x10);
        zVar7 = (**(code **)(*plVar5 + 0x3c0))
                          (plVar5,hMetricProgrammable,parameterCount,pParameterValues,pName,
                           pDescription,pMetricHandleCount,phMetricHandles);
        if (zVar7 != ZE_RESULT_SUCCESS) {
          logAndPropagateResult("zetMetricCreateFromProgrammableExp2",zVar7);
          local_b0 = zVar7;
          break;
        }
        bVar11 = uVar9 < uVar10;
        lVar1 = (-(ulong)(uVar10 == 0) - uVar10) + uVar9;
        uVar9 = uVar9 + 1;
      } while (lVar1 != 0);
    }
    if (bVar11) {
      return local_b0;
    }
    if ((*(char *)(lVar6 + 4) == '\x01') &&
       (zVar7 = ZETHandleLifetimeValidation::zetMetricCreateFromProgrammableExp2Prologue
                          ((ZETHandleLifetimeValidation *)(*(long *)(lVar6 + 0xd48) + 0x10),
                           hMetricProgrammable,parameterCount,pParameterValues,pName,pDescription,
                           pMetricHandleCount,phMetricHandles), zVar7 != ZE_RESULT_SUCCESS)) {
      logAndPropagateResult("zetMetricCreateFromProgrammableExp2",zVar7);
      return zVar7;
    }
    uVar8 = (*pcVar3)(hMetricProgrammable,parameterCount,pParameterValues,pName,pDescription,
                      pMetricHandleCount,phMetricHandles);
    bVar11 = lVar4 != lVar2;
    if (bVar11) {
      uVar9 = 1;
      do {
        plVar5 = *(long **)(*(long *)(*(long *)(lVar6 + 0xd30) + -8 + uVar9 * 8) + 0x10);
        zVar7 = (**(code **)(*plVar5 + 0x3c8))
                          (plVar5,hMetricProgrammable,parameterCount,pParameterValues,pName,
                           pDescription,pMetricHandleCount,phMetricHandles,uVar8);
        if (zVar7 != ZE_RESULT_SUCCESS) {
          logAndPropagateResult("zetMetricCreateFromProgrammableExp2",zVar7);
          local_b0 = zVar7;
          break;
        }
        bVar11 = uVar9 < uVar10;
        lVar2 = uVar9 + (-(ulong)(uVar10 == 0) - uVar10);
        uVar9 = uVar9 + 1;
      } while (lVar2 != 0);
    }
    if (bVar11) {
      return local_b0;
    }
    zVar7 = (ze_result_t)uVar8;
    if (((zVar7 == ZE_RESULT_SUCCESS) && (*(char *)(lVar6 + 4) == '\x01')) &&
       (phMetricHandles != (zet_metric_handle_t *)0x0)) {
      uVar10 = 0;
      do {
        if (*pMetricHandleCount <= uVar10) break;
        if (phMetricHandles[uVar10] != (zet_metric_handle_t)0x0) {
          HandleLifetimeValidation::addHandle
                    (*(HandleLifetimeValidation **)(lVar6 + 0xd48),phMetricHandles[uVar10]);
          HandleLifetimeValidation::addDependent
                    (*(HandleLifetimeValidation **)(lVar6 + 0xd48),hMetricProgrammable,
                     phMetricHandles[uVar10]);
        }
        uVar10 = uVar10 + 1;
      } while (phMetricHandles != (zet_metric_handle_t *)0x0);
    }
  }
  logAndPropagateResult("zetMetricCreateFromProgrammableExp2",zVar7);
  return zVar7;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetMetricCreateFromProgrammableExp2(
        zet_metric_programmable_exp_handle_t hMetricProgrammable,   ///< [in] handle of the metric programmable
        uint32_t parameterCount,                        ///< [in] Count of parameters to set.
        zet_metric_programmable_param_value_exp_t* pParameterValues,///< [in] list of parameter values to be set.
        const char* pName,                              ///< [in] pointer to metric name to be used. Must point to a
                                                        ///< null-terminated character array no longer than ::ZET_MAX_METRIC_NAME.
        const char* pDescription,                       ///< [in] pointer to metric description to be used. Must point to a
                                                        ///< null-terminated character array no longer than
                                                        ///< ::ZET_MAX_METRIC_DESCRIPTION.
        uint32_t* pMetricHandleCount,                   ///< [in,out] Pointer to the number of metric handles.
                                                        ///< if count is zero, then the driver shall update the value with the
                                                        ///< number of metric handles available for this programmable.
                                                        ///< if count is greater than the number of metric handles available, then
                                                        ///< the driver shall update the value with the correct number of metric
                                                        ///< handles available.
        zet_metric_handle_t* phMetricHandles            ///< [in,out][optional][range(0,*pMetricHandleCount)] array of handle of metrics.
                                                        ///< if count is less than the number of metrics available, then driver
                                                        ///< shall only retrieve that number of metric handles.
        )
    {
        context.logger->log_trace("zetMetricCreateFromProgrammableExp2(hMetricProgrammable, parameterCount, pParameterValues, pName, pDescription, pMetricHandleCount, phMetricHandles)");

        auto pfnCreateFromProgrammableExp2 = context.zetDdiTable.MetricExp.pfnCreateFromProgrammableExp2;

        if( nullptr == pfnCreateFromProgrammableExp2 )
            return logAndPropagateResult("zetMetricCreateFromProgrammableExp2", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zetValidation->zetMetricCreateFromProgrammableExp2Prologue( hMetricProgrammable, parameterCount, pParameterValues, pName, pDescription, pMetricHandleCount, phMetricHandles );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zetMetricCreateFromProgrammableExp2", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zetHandleLifetime.zetMetricCreateFromProgrammableExp2Prologue( hMetricProgrammable, parameterCount, pParameterValues, pName, pDescription, pMetricHandleCount, phMetricHandles );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zetMetricCreateFromProgrammableExp2", result);
        }

        auto driver_result = pfnCreateFromProgrammableExp2( hMetricProgrammable, parameterCount, pParameterValues, pName, pDescription, pMetricHandleCount, phMetricHandles );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zetValidation->zetMetricCreateFromProgrammableExp2Epilogue( hMetricProgrammable, parameterCount, pParameterValues, pName, pDescription, pMetricHandleCount, phMetricHandles ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zetMetricCreateFromProgrammableExp2", result);
        }


        if( driver_result == ZE_RESULT_SUCCESS && context.enableHandleLifetime ){
            
            for (size_t i = 0; ( nullptr != phMetricHandles) && (i < *pMetricHandleCount); ++i){
                if (phMetricHandles[i]){
                    context.handleLifetime->addHandle( phMetricHandles[i] );
                    context.handleLifetime->addDependent( hMetricProgrammable, phMetricHandles[i] );
                }
            }
        }
        return logAndPropagateResult("zetMetricCreateFromProgrammableExp2", driver_result);
    }